

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_all.cc
# Opt level: O3

int X509_CRL_sign_ctx(X509_CRL *x,EVP_MD_CTX *ctx)

{
  int iVar1;
  
  asn1_encoding_clear((ASN1_ENCODING *)&x->crl->enc);
  iVar1 = ASN1_item_sign_ctx((ASN1_ITEM *)&X509_CRL_INFO_it,x->crl->sig_alg,x->sig_alg,x->signature,
                             x->crl,ctx);
  return iVar1;
}

Assistant:

int X509_CRL_sign_ctx(X509_CRL *x, EVP_MD_CTX *ctx) {
  asn1_encoding_clear(&x->crl->enc);
  return ASN1_item_sign_ctx(ASN1_ITEM_rptr(X509_CRL_INFO), x->crl->sig_alg,
                            x->sig_alg, x->signature, x->crl, ctx);
}